

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

uint32_t cfd::core::TxIn::EstimateTxInSize
                   (AddressType addr_type,Script *redeem_script,uint32_t *witness_area_size,
                   uint32_t *no_witness_area_size,Script *scriptsig_template)

{
  bool bVar1;
  CfdException *this;
  size_t sVar2;
  CfdException *except;
  uint32_t local_cc;
  undefined1 local_c8 [4];
  uint32_t reqnum;
  size_t local_b0;
  size_t redeem_script_size;
  undefined1 local_8d;
  allocator local_79;
  string local_78;
  CfdSourceLocation local_58;
  int local_40;
  uint32_t local_3c;
  uint32_t script_size;
  uint32_t witness_size;
  uint32_t size;
  bool use_unlocking_script;
  bool is_taproot;
  bool is_witness;
  bool is_pubkey;
  Script *scriptsig_template_local;
  uint32_t *no_witness_area_size_local;
  uint32_t *witness_area_size_local;
  Script *redeem_script_local;
  AddressType addr_type_local;
  
  witness_size._3_1_ = 0;
  witness_size._2_1_ = 1;
  witness_size._1_1_ = 0;
  witness_size._0_1_ = 1;
  script_size = 0x29;
  local_3c = 0;
  local_40 = 0;
  _size = scriptsig_template;
  scriptsig_template_local = (Script *)no_witness_area_size;
  no_witness_area_size_local = witness_area_size;
  witness_area_size_local = (uint32_t *)redeem_script;
  redeem_script_local._4_4_ = addr_type;
  switch(addr_type) {
  case kP2shAddress:
    witness_size._2_1_ = 0;
    break;
  case kP2pkhAddress:
    witness_size._3_1_ = 1;
    witness_size._2_1_ = 0;
    break;
  case kP2wshAddress:
    witness_size._0_1_ = 0;
    break;
  case kP2wpkhAddress:
    witness_size._3_1_ = 1;
    witness_size._0_1_ = 0;
    break;
  case kP2shP2wshAddress:
    break;
  case kP2shP2wpkhAddress:
    witness_size._3_1_ = 1;
    break;
  case kTaprootAddress:
    witness_size._1_1_ = 1;
    witness_size._0_1_ = 0;
    break;
  default:
    bVar1 = Script::IsEmpty(redeem_script);
    if (bVar1) {
      local_58.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_transaction.cpp"
                   ,0x2f);
      local_58.filename = local_58.filename + 1;
      local_58.line = 0x6f;
      local_58.funcname = "EstimateTxInSize";
      logger::warn<>(&local_58,"unknown address type, and empty redeem script.");
      local_8d = 1;
      this = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_78,"unknown address type, and empty redeem script.",&local_79);
      CfdException::CfdException(this,kCfdIllegalArgumentError,&local_78);
      local_8d = 0;
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    witness_size._2_1_ = 0;
  }
  if ((witness_size._3_1_ & 1) == 0) {
    if ((_size == (Script *)0x0) || (bVar1 = Script::IsEmpty(_size), bVar1)) {
      if ((witness_size._1_1_ & 1) == 0) {
        local_40 = 0x8c;
        bVar1 = Script::IsEmpty(redeem_script);
        if (!bVar1) {
          Script::GetData((ByteData *)local_c8,redeem_script);
          sVar2 = ByteData::GetSerializeSize((ByteData *)local_c8);
          ByteData::~ByteData((ByteData *)local_c8);
          local_b0._0_4_ = (int)sVar2;
          local_40 = local_40 + (int)local_b0;
          local_cc = 0;
          local_b0 = sVar2;
          ScriptUtil::ExtractPubkeysFromMultisigScript
                    ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&except,
                     redeem_script,&local_cc);
          ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                    ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&except);
          if (local_cc != 0) {
            local_40 = local_cc * 0x4a + (int)local_b0 + 2;
          }
        }
      }
      else {
        local_40 = 0x42;
      }
    }
    else {
      Script::GetData((ByteData *)&redeem_script_size,_size);
      sVar2 = ByteData::GetSerializeSize((ByteData *)&redeem_script_size);
      local_40 = (int)sVar2;
      ByteData::~ByteData((ByteData *)&redeem_script_size);
    }
  }
  else {
    local_40 = 0x6c;
  }
  if ((witness_size._2_1_ & 1) == 0) {
    script_size = local_40 + 1 + script_size;
  }
  else {
    local_3c = local_40 + 1;
    if (((byte)witness_size & 1) != 0) {
      if ((witness_size._3_1_ & 1) == 0) {
        script_size = script_size + 0x23;
      }
      else {
        script_size = script_size + 0x17;
      }
    }
  }
  if (no_witness_area_size_local != (uint32_t *)0x0) {
    *no_witness_area_size_local = local_3c;
  }
  if (scriptsig_template_local != (Script *)0x0) {
    *(uint32_t *)&scriptsig_template_local->_vptr_Script = script_size;
  }
  return local_3c + script_size;
}

Assistant:

uint32_t TxIn::EstimateTxInSize(
    AddressType addr_type, Script redeem_script, uint32_t *witness_area_size,
    uint32_t *no_witness_area_size, const Script *scriptsig_template) {
  bool is_pubkey = false;
  bool is_witness = true;
  bool is_taproot = false;
  bool use_unlocking_script = true;
  uint32_t size = kMinimumTxInSize;
  uint32_t witness_size = 0;
  uint32_t script_size = 0;

  switch (addr_type) {
    case AddressType::kP2shAddress:
      is_witness = false;
      break;
    case AddressType::kP2pkhAddress:
      is_pubkey = true;
      is_witness = false;
      break;
    case AddressType::kP2wshAddress:
      use_unlocking_script = false;
      break;
    case AddressType::kP2wpkhAddress:
      is_pubkey = true;
      use_unlocking_script = false;
      break;
    case AddressType::kP2shP2wshAddress:
      break;
    case AddressType::kP2shP2wpkhAddress:
      is_pubkey = true;
      break;
    case AddressType::kTaprootAddress:
      is_taproot = true;
      use_unlocking_script = false;
      break;
    default:
      if (redeem_script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "unknown address type, and empty redeem script.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unknown address type, and empty redeem script.");
      }
      is_witness = false;
      break;
  }

  if (is_pubkey) {
    script_size = Pubkey::kCompressedPubkeySize + EC_SIGNATURE_DER_MAX_LEN + 3;
  } else if (
      (scriptsig_template != nullptr) && (!scriptsig_template->IsEmpty())) {
    script_size = static_cast<uint32_t>(
        scriptsig_template->GetData().GetSerializeSize());
  } else if (is_taproot) {
    // signature(64byte) + sighash type(1byte) + serialized(1byte)
    script_size = SchnorrSignature::kSchnorrSignatureSize + 2;
  } else {
    // Forehead is a big size
    script_size = (EC_SIGNATURE_DER_MAX_LEN - 2) * 2;
    if (!redeem_script.IsEmpty()) {
      size_t redeem_script_size = redeem_script.GetData().GetSerializeSize();
      script_size += static_cast<uint32_t>(redeem_script_size);
      try {
        // OP_0 <sig1> <sig2> ... <unlocking script>
        uint32_t reqnum = 0;
        ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script, &reqnum);
        if (reqnum != 0) {
          // set multisig size
          script_size = static_cast<uint32_t>(redeem_script_size);
          script_size += (EC_SIGNATURE_DER_MAX_LEN + 2) * reqnum;
          script_size += 2;  // for top OP_0 size
        }
      } catch (const CfdException &except) {
        if (except.GetErrorCode() != CfdError::kCfdIllegalArgumentError) {
          // error occurs other than multisig confirmation
          throw except;
        }
      }
    }
  }

  if (is_witness) {
    witness_size = script_size + 1;  // witness stack count area(1byte)
    if (!use_unlocking_script) {
      // do nothing
    } else if (is_pubkey) {
      size += 23;  // wpkh locking script length + serialize size(1byte)
    } else {
      size += 35;  // wsh locking script length + serialize size(1byte)
    }
  } else {
    size += script_size + 1;  // serialize size(1byte)
  }
  if (witness_area_size != nullptr) {
    *witness_area_size = static_cast<uint32_t>(witness_size);
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size = static_cast<uint32_t>(size);
  }
  size += witness_size;
  return static_cast<uint32_t>(size);
}